

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aes_ocb_ctrl(EVP_CIPHER_CTX *c,int type,int arg,void *ptr)

{
  int iVar1;
  void *pvVar2;
  OCB128_CONTEXT *src;
  OCB128_CONTEXT *dest;
  EVP_CIPHER_CTX *in_RCX;
  int in_EDX;
  uint in_ESI;
  EVP_CIPHER_CTX *in_RDI;
  EVP_AES_OCB_CTX *new_octx;
  EVP_CIPHER_CTX *newc;
  EVP_AES_OCB_CTX *octx;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  pvVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  src = (OCB128_CONTEXT *)(ulong)in_ESI;
  switch(src) {
  case (OCB128_CONTEXT *)0x0:
    *(undefined4 *)((long)pvVar2 + 0x1f0) = 0;
    *(undefined4 *)((long)pvVar2 + 500) = 0;
    iVar1 = EVP_CIPHER_get_iv_length(in_RDI->cipher);
    *(int *)((long)pvVar2 + 0x2e8) = iVar1;
    *(uchar **)((long)pvVar2 + 0x2a8) = in_RDI->iv;
    *(undefined4 *)((long)pvVar2 + 0x2ec) = 0x10;
    *(undefined4 *)((long)pvVar2 + 0x2e0) = 0;
    *(undefined4 *)((long)pvVar2 + 0x2e4) = 0;
    local_4 = 1;
    break;
  default:
    local_4 = -1;
    break;
  case (OCB128_CONTEXT *)0x8:
    dest = (OCB128_CONTEXT *)EVP_CIPHER_CTX_get_cipher_data(in_RCX);
    local_4 = CRYPTO_ocb128_copy_ctx(dest,src,in_stack_ffffffffffffffb8,(void *)0x25ff64);
    break;
  case (OCB128_CONTEXT *)0x9:
    if ((in_EDX < 1) || (0xf < in_EDX)) {
      local_4 = 0;
    }
    else {
      *(int *)((long)pvVar2 + 0x2e8) = in_EDX;
      local_4 = 1;
    }
    break;
  case (OCB128_CONTEXT *)0x10:
    if ((in_EDX == *(int *)((long)pvVar2 + 0x2ec)) &&
       (iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI), iVar1 != 0)) {
      memcpy(in_RCX,(void *)((long)pvVar2 + 0x2b0),(long)in_EDX);
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    break;
  case (OCB128_CONTEXT *)0x11:
    if (in_RCX == (EVP_CIPHER_CTX *)0x0) {
      if ((in_EDX < 0) || (0x10 < in_EDX)) {
        local_4 = 0;
      }
      else {
        *(int *)((long)pvVar2 + 0x2ec) = in_EDX;
        local_4 = 1;
      }
    }
    else if ((in_EDX == *(int *)((long)pvVar2 + 0x2ec)) &&
            (iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI), iVar1 == 0)) {
      memcpy((void *)((long)pvVar2 + 0x2b0),in_RCX,(long)in_EDX);
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    break;
  case (OCB128_CONTEXT *)0x25:
    *(undefined4 *)&in_RCX->cipher = *(undefined4 *)((long)pvVar2 + 0x2e8);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int aes_ocb_ctrl(EVP_CIPHER_CTX *c, int type, int arg, void *ptr)
{
    EVP_AES_OCB_CTX *octx = EVP_C_DATA(EVP_AES_OCB_CTX,c);
    EVP_CIPHER_CTX *newc;
    EVP_AES_OCB_CTX *new_octx;

    switch (type) {
    case EVP_CTRL_INIT:
        octx->key_set = 0;
        octx->iv_set = 0;
        octx->ivlen = EVP_CIPHER_get_iv_length(c->cipher);
        octx->iv = c->iv;
        octx->taglen = 16;
        octx->data_buf_len = 0;
        octx->aad_buf_len = 0;
        return 1;

    case EVP_CTRL_GET_IVLEN:
        *(int *)ptr = octx->ivlen;
        return 1;

    case EVP_CTRL_AEAD_SET_IVLEN:
        /* IV len must be 1 to 15 */
        if (arg <= 0 || arg > 15)
            return 0;

        octx->ivlen = arg;
        return 1;

    case EVP_CTRL_AEAD_SET_TAG:
        if (ptr == NULL) {
            /* Tag len must be 0 to 16 */
            if (arg < 0 || arg > 16)
                return 0;

            octx->taglen = arg;
            return 1;
        }
        if (arg != octx->taglen || EVP_CIPHER_CTX_is_encrypting(c))
            return 0;
        memcpy(octx->tag, ptr, arg);
        return 1;

    case EVP_CTRL_AEAD_GET_TAG:
        if (arg != octx->taglen || !EVP_CIPHER_CTX_is_encrypting(c))
            return 0;

        memcpy(ptr, octx->tag, arg);
        return 1;

    case EVP_CTRL_COPY:
        newc = (EVP_CIPHER_CTX *)ptr;
        new_octx = EVP_C_DATA(EVP_AES_OCB_CTX,newc);
        return CRYPTO_ocb128_copy_ctx(&new_octx->ocb, &octx->ocb,
                                      &new_octx->ksenc.ks,
                                      &new_octx->ksdec.ks);

    default:
        return -1;

    }
}